

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O3

log_map log_map_create(size_t size)

{
  size_t sVar1;
  log_map __ptr;
  log_map_bucket_conflict __ptr_00;
  log_map_bucket_conflict *pplVar2;
  ulong uVar3;
  
  sVar1 = log_valid_size(size);
  uVar3 = 0x10000;
  if (sVar1 < 0x10000) {
    uVar3 = sVar1;
  }
  sVar1 = 0x100;
  if (0x100 < uVar3) {
    sVar1 = uVar3;
  }
  __ptr = (log_map)malloc(0x38);
  if (__ptr != (log_map)0x0) {
    __ptr_00 = (log_map_bucket_conflict)calloc(1,sVar1 * 0x18);
    (__ptr->table).data = __ptr_00;
    if (__ptr_00 != (log_map_bucket_conflict)0x0) {
      (__ptr->table).count = 0;
      (__ptr->table).size = sVar1;
      pplVar2 = (log_map_bucket_conflict *)calloc(1,sVar1 * 8);
      (__ptr->block).data = pplVar2;
      if (pplVar2 != (log_map_bucket_conflict *)0x0) {
        (__ptr->block).count = 0;
        (__ptr->block).size = sVar1;
        (__ptr->block).position = 0x100;
        return __ptr;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (log_map)0x0;
}

Assistant:

log_map log_map_create(size_t size)
{
	size_t iterator;

	log_map map = NULL;

	size = log_valid_size(size);

	if (size < LOG_MAP_MIN_SIZE)
	{
		size = LOG_MAP_MIN_SIZE;
	}
	else if (size > LOG_MAP_MAX_SIZE)
	{
		size = LOG_MAP_MAX_SIZE;
	}

	map = malloc(sizeof(struct log_map_type));

	if (map == NULL)
	{
		return NULL;
	}

	map->table.data = malloc(sizeof(struct log_map_bucket_type) * size);

	if (map->table.data == NULL)
	{
		free(map);

		return NULL;
	}

	map->table.count = 0;
	map->table.size = size;

	for (iterator = 0; iterator < map->table.size; ++iterator)
	{
		log_map_bucket bucket = &map->table.data[iterator];

		bucket->key = NULL;
		bucket->value = NULL;
		bucket->next = NULL;
	}

	map->block.data = malloc(sizeof(log_map_bucket) * size);

	if (map->block.data == NULL)
	{
		free(map->table.data);

		free(map);

		return NULL;
	}

	map->block.count = 0;
	map->block.size = size;
	map->block.position = LOG_MAP_BUCKET_SIZE;

	for (iterator = 0; iterator < map->block.size; ++iterator)
	{
		map->block.data[iterator] = NULL;
	}

	return map;
}